

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall helics::CommsInterface::setName(CommsInterface *this,string *commName)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  
  bVar1 = propertyLock(in_RDI);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void CommsInterface::setName(const std::string& commName)
{
    if (propertyLock()) {
        name = commName;
        propertyUnLock();
    }
}